

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O0

bool __thiscall embree::barrier_sys_regression_test::run(barrier_sys_regression_test *this)

{
  memory_order mVar1;
  uint uVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  reference pvVar4;
  __int_type _Var5;
  EVP_PKEY_CTX *ctx;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  byte bVar6;
  ssize_t in_stack_00000018;
  size_t in_stack_00000020;
  void *in_stack_00000028;
  thread_func in_stack_00000030;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_> threads;
  size_t numThreads;
  memory_order __b_1;
  memory_order __b;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  undefined4 in_stack_ffffffffffffff28;
  int iVar7;
  thread_t tid;
  int iVar8;
  EVP_PKEY_CTX *local_a8;
  EVP_PKEY_CTX *local_a0;
  EVP_PKEY_CTX *local_98;
  ulong local_90;
  thread_t local_78;
  EVP_PKEY_CTX *local_70;
  vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_> local_68;
  EVP_PKEY_CTX *local_50;
  undefined8 local_40;
  memory_order local_38;
  int local_34;
  undefined8 local_30;
  pointer *local_28;
  pointer local_20;
  memory_order local_18;
  int local_14;
  pointer local_10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_8;
  
  pvVar3 = in_RDI + 2;
  local_10 = (pointer)0x0;
  local_14 = 5;
  local_8 = pvVar3;
  local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_20 = local_10;
  if (local_14 == 3) {
    (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start = local_10;
  }
  else if (local_14 == 5) {
    LOCK();
    (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start = local_10;
    UNLOCK();
  }
  else {
    (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start = local_10;
  }
  tid = (thread_t)
        &in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
  local_30 = 0;
  local_34 = 5;
  iVar8 = local_14;
  local_28 = (pointer *)tid;
  mVar1 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_40 = local_30;
  if (local_34 == 3) {
    *(undefined8 *)tid = local_30;
  }
  else if (local_34 == 5) {
    LOCK();
    *(undefined8 *)tid = local_30;
    UNLOCK();
  }
  else {
    *(undefined8 *)tid = local_30;
  }
  iVar7 = local_34;
  local_38 = mVar1;
  uVar2 = getNumberOfLogicalThreads();
  local_50 = (EVP_PKEY_CTX *)(ulong)uVar2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(in_RDI,CONCAT44(iVar8,mVar1));
  ctx = local_50 + 1;
  BarrierSys::init((BarrierSys *)
                   &in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,ctx);
  std::vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_>::vector
            ((vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_> *)
             0x48ab17);
  for (local_70 = (EVP_PKEY_CTX *)0x0; local_70 < local_50; local_70 = local_70 + 1) {
    local_78 = createThread(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018)
    ;
    ctx = (EVP_PKEY_CTX *)&local_78;
    std::vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_>::push_back
              ((vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_> *)
               local_78,(value_type *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18))
    ;
  }
  for (local_90 = 0; local_90 < 1000; local_90 = local_90 + 1) {
    for (local_98 = (EVP_PKEY_CTX *)0x0; local_98 < local_50; local_98 = local_98 + 1) {
      ctx = local_98;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &in_RDI[2].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(size_type)local_98);
      *pvVar4 = 0;
    }
    BarrierSys::wait((BarrierSys *)
                     &in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,ctx);
    BarrierSys::wait((BarrierSys *)
                     &in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,ctx);
    for (local_a0 = (EVP_PKEY_CTX *)0x0; local_a0 < local_50; local_a0 = local_a0 + 1) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &in_RDI[2].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(size_type)local_a0);
      ctx = (EVP_PKEY_CTX *)(ulong)((EVP_PKEY_CTX *)*pvVar4 != local_a0);
      std::__atomic_base<unsigned_long>::operator+=
                ((__atomic_base<unsigned_long> *)
                 &in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish,(__int_type)ctx);
    }
  }
  for (local_a8 = (EVP_PKEY_CTX *)0x0; local_a8 < local_50; local_a8 = local_a8 + 1) {
    std::vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_>::operator[]
              (&local_68,(size_type)local_a8);
    join(tid);
  }
  _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)CONCAT44(iVar7,in_stack_ffffffffffffff28));
  bVar6 = _Var5 == 0;
  std::vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_>::~vector
            ((vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_> *)tid);
  return (bool)(bVar6 & 1);
}

Assistant:

bool run ()
    {
      threadID.store(0);
      numFailed.store(0);

      size_t numThreads = getNumberOfLogicalThreads();
      threadResults.resize(numThreads);
      barrier.init(numThreads+1);

      /* create threads */
      std::vector<thread_t> threads;
      for (size_t i=0; i<numThreads; i++)
        threads.push_back(createThread((thread_func)thread_alloc,this));

      /* run test */ 
      for (size_t i=0; i<1000; i++)
      {
        for (size_t i=0; i<numThreads; i++) threadResults[i] = 0;
        barrier.wait();
        barrier.wait();
        for (size_t i=0; i<numThreads; i++) numFailed += threadResults[i] != i;
      }

      /* destroy threads */
      for (size_t i=0; i<numThreads; i++)
        join(threads[i]);

      return numFailed == 0;
    }